

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O3

callbacks __thiscall
pstore::exchange::import_ns::callbacks::make<pstore::exchange::import_ns::root>
          (callbacks *this,not_null<pstore::database_*> db)

{
  context *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  tVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer *__ptr;
  pointer __p;
  callbacks cVar4;
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  __uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_48;
  _Head_base<0UL,_pstore::exchange::import_ns::root_*,_false> local_40;
  shared_ptr<pstore::exchange::import_ns::context> local_38;
  not_null<pstore::exchange::import_ns::context_*> local_28;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00233cd0;
  this_00 = (context *)(p_Var1 + 1);
  context::context(this_00,db);
  local_38.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  local_38.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  tVar2.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )operator_new(0x10);
  local_28.ptr_ = this_00;
  gsl::not_null<pstore::exchange::import_ns::context_*>::ensure_invariant(&local_28);
  *(context **)
   ((long)tVar2.
          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl + 8) =
       local_28.ptr_;
  *(undefined ***)
   tVar2.
   super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
   .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       &PTR__rule_0023c160;
  local_40._M_head_impl = (root *)0x0;
  local_48._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )(tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          )tVar2.
           super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
           .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl;
  callbacks(this,&local_38,
            (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             *)&local_48);
  if ((_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
       )local_48._M_t.
        super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl !=
      (rule *)0x0) {
    (**(code **)(*(long *)local_48._M_t.
                          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>.
                          _M_head_impl + 8))();
  }
  local_48._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )(_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          )0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::root,_std::default_delete<pstore::exchange::import_ns::root>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::root,_std::default_delete<pstore::exchange::import_ns::root>_>
                 *)&local_40);
  _Var3._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  cVar4.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  cVar4.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (callbacks)
         cVar4.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }